

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

void __thiscall Printer::PrintHeader(Printer *this,ostream *c)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this->attrCount < 1) {
    std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
  }
  else {
    lVar2 = 0;
    iVar4 = 0;
    do {
      iVar3 = iVar4;
      __s = this->psHeader[lVar2];
      if (__s == (char *)0x0) {
        std::ios::clear((int)c + (int)*(undefined8 *)(*(long *)c + -0x18));
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(c,__s,sVar1);
      }
      sVar1 = strlen(this->psHeader[lVar2]);
      iVar5 = this->spaces[lVar2];
      if (0 < iVar5) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(c," ",1);
          iVar4 = iVar4 + 1;
          iVar5 = this->spaces[lVar2];
        } while (iVar4 < iVar5);
      }
      iVar4 = iVar3 + (int)sVar1 + iVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->attrCount);
    std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
    if (0 < iVar4) {
      iVar4 = (int)sVar1 + iVar5 + iVar3;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(c,"-",1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(c,"\n",1);
  return;
}

Assistant:

void Printer::PrintHeader( ostream &c ) const
{
    int dashes = 0;
    int iLen;
    int i,j;

    for (i = 0; i < attrCount; i++) {
        // Print out the header information name
        c << psHeader[i];
        iLen = strlen(psHeader[i]);
        dashes += iLen;

        for (j = 0; j < spaces[i]; j++)
            c << " ";

        dashes += spaces[i];
    }

    c << "\n";
    for (i = 0; i < dashes; i++) c << "-";
    c << "\n";
}